

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O3

void __thiscall RangeSize::RangeSize(RangeSize *this,IntVar *_x,IntVar *_y)

{
  RangeSize *local_20;
  
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020be88;
  (this->super_Propagator).prop_id = engine.propagators.sz;
  (this->super_Propagator).priority = 0;
  (this->super_Propagator).satisfied = '\0';
  (this->super_Propagator).in_queue = false;
  local_20 = this;
  vec<Propagator_*>::push(&engine.propagators,(Propagator **)&local_20);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020ed58;
  this->x = _x;
  this->y = _y;
  (this->super_Propagator).priority = 1;
  (*(_x->super_Var).super_Branching._vptr_Branching[7])(_x,this,0,6);
  return;
}

Assistant:

RangeSize(IntVar* _x, IntVar* _y) : x(_x), y(_y) {
		priority = 1;
		x->attach(this, 0, EVENT_LU);
	}